

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_factory.cpp
# Opt level: O1

void bidfx_public_api::tools::LoggerFactory::SetLogLevel(level_enum level)

{
  long lVar1;
  _Base_ptr this;
  _Rb_tree_node_base *p_Var2;
  
  p_Var2 = (_Rb_tree_node_base *)loggers_._24_8_;
  level_ = level;
  if (loggers_._24_8_ != 0x1edc78) {
    do {
      lVar1 = *(long *)(p_Var2 + 1);
      this = p_Var2[1]._M_parent;
      if (this == (_Base_ptr)0x0) {
        LOCK();
        *(level_enum *)(lVar1 + 0x40) = level;
        UNLOCK();
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
        }
        LOCK();
        *(level_enum *)(lVar1 + 0x40) = level;
        UNLOCK();
        if (this != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
        }
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)(loggers_ + 8));
  }
  return;
}

Assistant:

void LoggerFactory::SetLogLevel(spdlog::level::level_enum level)
{
    level_ = level;
    for(auto logger : loggers_)
    {
        logger->set_level(level);
    }
}